

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  EventTriggerStatementSyntax *pEVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000028;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000030;
  BumpAllocator *in_stack_000000c8;
  Token *in_stack_000000d0;
  BumpAllocator *in_stack_ffffffffffffff78;
  NamedLabelSyntax *in_stack_ffffffffffffff80;
  TimingControlSyntax *local_68;
  Token *args_6;
  
  args_6 = (Token *)__fn;
  if (*(long *)(__fn + 0x18) != 0) {
    deepClone<slang::syntax::NamedLabelSyntax>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000030,in_stack_00000028);
  TVar2 = parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  if (args_6[6].info == (Info *)0x0) {
    local_68 = (TimingControlSyntax *)0x0;
  }
  else {
    local_68 = deepClone<slang::syntax::TimingControlSyntax>
                         ((TimingControlSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                         );
  }
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x797875);
  deepClone<slang::syntax::NameSyntax>
            ((NameSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  TVar3 = parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EventTriggerStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::TimingControlSyntax*,slang::syntax::NameSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)TVar2.info,TVar2._0_8_,(NamedLabelSyntax **)local_68,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar3.info,TVar3._0_8_,
                      (TimingControlSyntax **)__fn,(NameSyntax *)__child_stack,args_6);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const EventTriggerStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<EventTriggerStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.trigger.deepClone(alloc),
        node.timing ? deepClone(*node.timing, alloc) : nullptr,
        *deepClone<NameSyntax>(*node.name, alloc),
        node.semi.deepClone(alloc)
    );
}